

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlm_gp.cpp
# Opt level: O1

tlm_extension_registry * tlm::anon_unknown_2::tlm_extension_registry::instance(void)

{
  _Rb_tree_header *p_Var1;
  
  if ((anonymous_namespace)::tlm_extension_registry::instance_ == (tlm_extension_registry *)0x0) {
    (anonymous_namespace)::tlm_extension_registry::instance_ =
         (tlm_extension_registry *)operator_new(0x30);
    p_Var1 = &((anonymous_namespace)::tlm_extension_registry::instance_->ids_)._M_t._M_impl.
              super__Rb_tree_header;
    ((anonymous_namespace)::tlm_extension_registry::instance_->ids_)._M_t._M_impl.
    super__Rb_tree_header._M_header._M_color = _S_red;
    ((anonymous_namespace)::tlm_extension_registry::instance_->ids_)._M_t._M_impl.
    super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    ((anonymous_namespace)::tlm_extension_registry::instance_->ids_)._M_t._M_impl.
    super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    ((anonymous_namespace)::tlm_extension_registry::instance_->ids_)._M_t._M_impl.
    super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    ((anonymous_namespace)::tlm_extension_registry::instance_->ids_)._M_t._M_impl.
    super__Rb_tree_header._M_node_count = 0;
  }
  return (anonymous_namespace)::tlm_extension_registry::instance_;
}

Assistant:

static tlm_extension_registry& instance()
    {
        if (!instance_) // don't cleanup registry
            instance_ = new tlm_extension_registry();
        return *instance_;
    }